

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.hpp
# Opt level: O1

compiler_token_type __thiscall
boost::xpressive::
compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::
get_group_type<char_const*>
          (compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
           *this,char **begin,char *end,string_type *name)

{
  byte bVar1;
  byte *pbVar2;
  char *pcVar3;
  compiler_token_type cVar4;
  char **ppcVar5;
  uint uVar6;
  bool cond;
  undefined **local_78 [2];
  undefined **local_68;
  refcount_ptr<boost::exception_detail::error_info_container> local_60;
  char *pcStack_58;
  char *local_50;
  undefined8 local_48;
  error_type local_40;
  source_location local_38;
  ulong uVar7;
  
  ppcVar5 = eat_ws_<char_const*>(this,begin,end);
  cVar4 = token_literal;
  if ((*ppcVar5 != end) && (cVar4 = token_literal, **begin == '?')) {
    *begin = *begin + 1;
    eat_ws_<char_const*>(this,begin,end);
    pbVar2 = (byte *)*begin;
    if (pbVar2 == (byte *)end) {
      std::runtime_error::runtime_error((runtime_error *)local_78,"incomplete extension");
      local_60.px_ = (error_info_container *)0x0;
      local_78[0] = &PTR__regex_error_00195328;
      local_68 = &PTR__regex_error_00195350;
      local_40 = error_paren;
      pcStack_58 = 
      "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_group_type(FwdIter &, FwdIter, string_type &) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
      ;
      local_50 = 
      "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
      ;
      local_48._0_4_ = 0xe0;
      local_48._4_4_ = -1;
      throw_exception<boost::xpressive::regex_error>((regex_error *)local_78);
    }
    bVar1 = *pbVar2;
    if (bVar1 < 0x50) {
      if (bVar1 < 0x2d) {
        if (bVar1 == 0x21) {
          *begin = (char *)(pbVar2 + 1);
          cVar4 = token_negative_lookahead;
        }
        else if (bVar1 == 0x23) {
          *begin = (char *)(pbVar2 + 1);
          cVar4 = token_comment;
        }
        else {
          if (bVar1 != 0x24) goto switchD_001271d2_caseD_3b;
          *begin = (char *)(pbVar2 + 1);
          get_name_<char_const*>(this,begin,end,name);
          pcVar3 = *begin;
          if (pcVar3 == end) {
            std::runtime_error::runtime_error((runtime_error *)local_78,"incomplete extension");
            local_60.px_ = (error_info_container *)0x0;
            local_78[0] = &PTR__regex_error_00195328;
            local_68 = &PTR__regex_error_00195350;
            local_40 = error_paren;
            pcStack_58 = 
            "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_group_type(FwdIter &, FwdIter, string_type &) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
            ;
            local_50 = 
            "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
            ;
            local_48._0_4_ = 0xec;
            local_48._4_4_ = -1;
            throw_exception<boost::xpressive::regex_error>((regex_error *)local_78);
          }
          cVar4 = token_rule_ref;
          if (*pcVar3 == '=') {
            *begin = pcVar3 + 1;
            cVar4 = token_rule_assign;
          }
        }
      }
      else {
        switch(bVar1) {
        case 0x3a:
          *begin = (char *)(pbVar2 + 1);
          cVar4 = token_no_mark;
          break;
        case 0x3c:
          *begin = (char *)(pbVar2 + 1);
          eat_ws_<char_const*>(this,begin,end);
          pcVar3 = *begin;
          if (pcVar3 == end) {
            std::runtime_error::runtime_error((runtime_error *)local_78,"incomplete extension");
            local_60.px_ = (error_info_container *)0x0;
            local_78[0] = &PTR__regex_error_00195328;
            local_68 = &PTR__regex_error_00195350;
            local_40 = error_paren;
            pcStack_58 = 
            "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_group_type(FwdIter &, FwdIter, string_type &) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
            ;
            local_50 = 
            "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
            ;
            local_48._0_4_ = 0xf6;
            local_48._4_4_ = -1;
            throw_exception<boost::xpressive::regex_error>((regex_error *)local_78);
          }
          if (*pcVar3 == '!') {
            *begin = pcVar3 + 1;
            cVar4 = token_negative_lookbehind;
          }
          else {
            if (*pcVar3 != '=') {
              std::runtime_error::runtime_error((runtime_error *)local_78,"unrecognized extension");
              local_60.px_ = (error_info_container *)0x0;
              pcStack_58 = (char *)0x0;
              local_50 = (char *)0x0;
              local_48._0_4_ = -1;
              local_48._4_4_ = -1;
              local_78[0] = &PTR__regex_error_00195328;
              local_68 = &PTR__regex_error_00195350;
              local_40 = error_badbrace;
              local_38.file_ =
                   "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
              ;
              local_38.function_ =
                   "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_group_type(FwdIter &, FwdIter, string_type &) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
              ;
              local_38.line_ = 0xfc;
              local_38.column_ = 0;
              throw_exception<boost::xpressive::regex_error>((regex_error *)local_78,&local_38);
            }
            *begin = pcVar3 + 1;
            cVar4 = token_positive_lookbehind;
          }
          break;
        case 0x3d:
          *begin = (char *)(pbVar2 + 1);
          cVar4 = token_positive_lookahead;
          break;
        case 0x3e:
          *begin = (char *)(pbVar2 + 1);
          cVar4 = token_independent_sub_expression;
          break;
        default:
          if (bVar1 == 0x2d) goto LAB_0012719f;
        case 0x3b:
switchD_001271d2_caseD_3b:
          std::runtime_error::runtime_error((runtime_error *)local_78,"unrecognized extension");
          local_60.px_ = (error_info_container *)0x0;
          pcStack_58 = (char *)0x0;
          local_50 = (char *)0x0;
          local_48._0_4_ = -1;
          local_48._4_4_ = -1;
          local_78[0] = &PTR__regex_error_00195328;
          local_68 = &PTR__regex_error_00195350;
          local_40 = error_badbrace;
          local_38.file_ =
               "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
          ;
          local_38.function_ =
               "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_group_type(FwdIter &, FwdIter, string_type &) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
          ;
          local_38.line_ = 0x118;
          local_38.column_ = 0;
          throw_exception<boost::xpressive::regex_error>((regex_error *)local_78,&local_38);
        }
      }
    }
    else {
      uVar6 = bVar1 - 0x50;
      uVar7 = (ulong)uVar6;
      if (0x28 < uVar6) goto switchD_001271d2_caseD_3b;
      if ((0x10822000000U >> (uVar7 & 0x3f) & 1) != 0) {
LAB_0012719f:
        cVar4 = parse_mods_<char_const*>(this,begin,end);
        return cVar4;
      }
      if (uVar7 == 0) {
        *begin = (char *)(pbVar2 + 1);
        eat_ws_<char_const*>(this,begin,end);
        pcVar3 = *begin;
        if (pcVar3 == end) {
          std::runtime_error::runtime_error((runtime_error *)local_78,"incomplete extension");
          local_60.px_ = (error_info_container *)0x0;
          local_78[0] = &PTR__regex_error_00195328;
          local_68 = &PTR__regex_error_00195350;
          local_40 = error_paren;
          pcStack_58 = 
          "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_group_type(FwdIter &, FwdIter, string_type &) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
          ;
          local_50 = 
          "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
          ;
          local_48._0_4_ = 0x101;
          local_48._4_4_ = -1;
          throw_exception<boost::xpressive::regex_error>((regex_error *)local_78);
        }
        if (*pcVar3 == '=') {
          *begin = pcVar3 + 1;
          get_name_<char_const*>(this,begin,end,name);
          detail::ensure_(*begin != end,error_paren,"incomplete extension",
                          "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_group_type(FwdIter &, FwdIter, string_type &) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
                          ,0x10a);
          cVar4 = token_named_mark_ref;
        }
        else {
          if (*pcVar3 != '<') {
            std::runtime_error::runtime_error((runtime_error *)local_78,"unrecognized extension");
            local_60.px_ = (error_info_container *)0x0;
            pcStack_58 = (char *)0x0;
            local_50 = (char *)0x0;
            local_48._0_4_ = -1;
            local_48._4_4_ = -1;
            local_78[0] = &PTR__regex_error_00195328;
            local_68 = &PTR__regex_error_00195350;
            local_40 = error_badbrace;
            local_38.file_ =
                 "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
            ;
            local_38.function_ =
                 "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_group_type(FwdIter &, FwdIter, string_type &) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
            ;
            local_38.line_ = 0x10d;
            local_38.column_ = 0;
            throw_exception<boost::xpressive::regex_error>((regex_error *)local_78,&local_38);
          }
          *begin = pcVar3 + 1;
          get_name_<char_const*>(this,begin,end,name);
          pcVar3 = *begin;
          if (pcVar3 == end) {
            cond = false;
          }
          else {
            *begin = pcVar3 + 1;
            cond = *pcVar3 == '>';
          }
          detail::ensure_(cond,error_paren,"incomplete extension",
                          "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_group_type(FwdIter &, FwdIter, string_type &) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
                          ,0x106);
          cVar4 = token_named_mark;
        }
      }
      else {
        if (uVar7 != 2) goto switchD_001271d2_caseD_3b;
        *begin = (char *)(pbVar2 + 1);
        cVar4 = token_recurse;
      }
    }
  }
  return cVar4;
}

Assistant:

regex_constants::compiler_token_type get_group_type(FwdIter &begin, FwdIter end, string_type &name)
    {
        using namespace regex_constants;
        if(this->eat_ws_(begin, end) != end && BOOST_XPR_CHAR_(char_type, '?') == *begin)
        {
            this->eat_ws_(++begin, end);
            BOOST_XPR_ENSURE_(begin != end, error_paren, "incomplete extension");

            switch(*begin)
            {
            case BOOST_XPR_CHAR_(char_type, ':'): ++begin; return token_no_mark;
            case BOOST_XPR_CHAR_(char_type, '>'): ++begin; return token_independent_sub_expression;
            case BOOST_XPR_CHAR_(char_type, '#'): ++begin; return token_comment;
            case BOOST_XPR_CHAR_(char_type, '='): ++begin; return token_positive_lookahead;
            case BOOST_XPR_CHAR_(char_type, '!'): ++begin; return token_negative_lookahead;
            case BOOST_XPR_CHAR_(char_type, 'R'): ++begin; return token_recurse;
            case BOOST_XPR_CHAR_(char_type, '$'):
                this->get_name_(++begin, end, name);
                BOOST_XPR_ENSURE_(begin != end, error_paren, "incomplete extension");
                if(BOOST_XPR_CHAR_(char_type, '=') == *begin)
                {
                    ++begin;
                    return token_rule_assign;
                }
                return token_rule_ref;

            case BOOST_XPR_CHAR_(char_type, '<'):
                this->eat_ws_(++begin, end);
                BOOST_XPR_ENSURE_(begin != end, error_paren, "incomplete extension");
                switch(*begin)
                {
                case BOOST_XPR_CHAR_(char_type, '='): ++begin; return token_positive_lookbehind;
                case BOOST_XPR_CHAR_(char_type, '!'): ++begin; return token_negative_lookbehind;
                default:
                    BOOST_THROW_EXCEPTION(regex_error(error_badbrace, "unrecognized extension"));
                }

            case BOOST_XPR_CHAR_(char_type, 'P'):
                this->eat_ws_(++begin, end);
                BOOST_XPR_ENSURE_(begin != end, error_paren, "incomplete extension");
                switch(*begin)
                {
                case BOOST_XPR_CHAR_(char_type, '<'):
                    this->get_name_(++begin, end, name);
                    BOOST_XPR_ENSURE_(begin != end && BOOST_XPR_CHAR_(char_type, '>') == *begin++, error_paren, "incomplete extension");
                    return token_named_mark;
                case BOOST_XPR_CHAR_(char_type, '='):
                    this->get_name_(++begin, end, name);
                    BOOST_XPR_ENSURE_(begin != end, error_paren, "incomplete extension");
                    return token_named_mark_ref;
                default:
                    BOOST_THROW_EXCEPTION(regex_error(error_badbrace, "unrecognized extension"));
                }

            case BOOST_XPR_CHAR_(char_type, 'i'):
            case BOOST_XPR_CHAR_(char_type, 'm'):
            case BOOST_XPR_CHAR_(char_type, 's'):
            case BOOST_XPR_CHAR_(char_type, 'x'):
            case BOOST_XPR_CHAR_(char_type, '-'):
                return this->parse_mods_(begin, end);

            default:
                BOOST_THROW_EXCEPTION(regex_error(error_badbrace, "unrecognized extension"));
            }
        }

        return token_literal;
    }